

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O3

void __thiscall arangodb::velocypack::Dumper::dumpValue(Dumper *this,Slice slice,Slice *base)

{
  CustomTypeHandler *pCVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  int64_t v;
  uint8_t *puVar7;
  Slice SVar8;
  _func_int **pp_Var9;
  Exception *this_00;
  uint8_t ret;
  byte bVar10;
  uint uVar11;
  ExceptionType type;
  uint64_t v_00;
  byte *pbVar12;
  undefined8 uVar13;
  Sink *pSVar14;
  uint8_t *puVar15;
  double v_01;
  ObjectPair OVar16;
  ValueLength len;
  Slice local_60;
  ArrayIterator local_58;
  double local_38;
  
  bVar2 = *slice._start;
  local_60._start = slice._start;
  if (((bVar2 & 0xfe) == 0xee & this->options->debugTags) == 1) {
    if (bVar2 == 0xee) {
      v_00 = (uint64_t)slice._start[1];
    }
    else {
      v_00 = *(uint64_t *)(slice._start + 1);
    }
    appendUInt(this,v_00);
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x3a);
    bVar2 = *slice._start;
  }
  switch(SliceStaticData::TypeMap[bVar2]) {
  case None:
  case Illegal:
  case MinKey:
  case MaxKey:
    goto switchD_001086cd_caseD_0;
  case Null:
    (*this->_sink->_vptr_Sink[3])(this->_sink,"null",4);
    return;
  case Bool:
    bVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBool
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_60);
    if (bVar4) {
      pcVar6 = "true";
      uVar13 = 4;
    }
    else {
      pcVar6 = "false";
      uVar13 = 5;
    }
    (*this->_sink->_vptr_Sink[3])(this->_sink,pcVar6,uVar13);
    break;
  case Array:
    ArrayIterator::ArrayIterator(&local_58,slice);
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x5b);
    if (this->options->prettyPrint == true) {
      (*this->_sink->_vptr_Sink[2])(this->_sink,10);
      iVar5 = this->_indentation;
      this->_indentation = iVar5 + 1;
      if (local_58._position != local_58._size) {
        do {
          indent(this);
          SVar8 = ArrayIterator::value(&local_58);
          dumpValue(this,SVar8,&local_60);
          if (local_58._position + 1 != local_58._size) {
            (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          }
          (*this->_sink->_vptr_Sink[2])(this->_sink,10);
          ArrayIterator::next(&local_58);
        } while (local_58._position != local_58._size);
        iVar5 = this->_indentation + -1;
      }
      this->_indentation = iVar5;
      indent(this);
    }
    else if (this->options->singleLinePrettyPrint == false) {
      if (local_58._position != local_58._size) {
        do {
          if (local_58._position != 0) {
            (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          }
          SVar8 = ArrayIterator::value(&local_58);
          dumpValue(this,SVar8,&local_60);
          ArrayIterator::next(&local_58);
        } while (local_58._position != local_58._size);
      }
    }
    else if (local_58._position != local_58._size) {
      do {
        if (local_58._position != 0) {
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x20);
        }
        SVar8 = ArrayIterator::value(&local_58);
        dumpValue(this,SVar8,&local_60);
        ArrayIterator::next(&local_58);
      } while (local_58._position != local_58._size);
    }
    pSVar14 = this->_sink;
    pp_Var9 = pSVar14->_vptr_Sink;
    uVar13 = 0x5d;
    goto LAB_00108adc;
  case Object:
    ObjectIterator::ObjectIterator
              ((ObjectIterator *)&local_58,slice,
               (bool)(this->options->dumpAttributesInIndexOrder ^ 1));
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x7b);
    if (this->options->prettyPrint == true) {
      (*this->_sink->_vptr_Sink[2])(this->_sink,10);
      iVar5 = this->_indentation;
      this->_indentation = iVar5 + 1;
      if (local_58._position != local_58._size) {
        do {
          OVar16 = ObjectIterator::operator*((ObjectIterator *)&local_58);
          indent(this);
          dumpValue(this,OVar16.key._start,&local_60);
          (*this->_sink->_vptr_Sink[3])(this->_sink," : ",3);
          dumpValue(this,OVar16.value._start,&local_60);
          if (local_58._position + 1 != local_58._size) {
            (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          }
          (*this->_sink->_vptr_Sink[2])(this->_sink,10);
          ObjectIterator::next((ObjectIterator *)&local_58);
        } while (local_58._position != local_58._size);
        iVar5 = this->_indentation + -1;
      }
      this->_indentation = iVar5;
      indent(this);
    }
    else if (this->options->singleLinePrettyPrint == false) {
      if (local_58._position != local_58._size) {
        do {
          if (local_58._position != 0) {
            (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          }
          OVar16 = ObjectIterator::operator*((ObjectIterator *)&local_58);
          dumpValue(this,OVar16.key._start,&local_60);
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x3a);
          dumpValue(this,OVar16.value._start,&local_60);
          ObjectIterator::next((ObjectIterator *)&local_58);
        } while (local_58._position != local_58._size);
      }
    }
    else if (local_58._position != local_58._size) {
      do {
        if (local_58._position != 0) {
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x20);
        }
        OVar16 = ObjectIterator::operator*((ObjectIterator *)&local_58);
        dumpValue(this,OVar16.key._start,&local_60);
        (*this->_sink->_vptr_Sink[2])(this->_sink,0x3a);
        (*this->_sink->_vptr_Sink[2])(this->_sink,0x20);
        dumpValue(this,OVar16.value._start,&local_60);
        ObjectIterator::next((ObjectIterator *)&local_58);
      } while (local_58._position != local_58._size);
    }
    pSVar14 = this->_sink;
    pp_Var9 = pSVar14->_vptr_Sink;
    uVar13 = 0x7d;
    goto LAB_00108adc;
  case Double:
    v_01 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getDouble
                     ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                      &local_60);
    if (NAN(v_01)) {
      if (this->options->unsupportedDoublesAsString == false) goto LAB_00108e0a;
      pSVar14 = this->_sink;
      pp_Var9 = pSVar14->_vptr_Sink;
      pcVar6 = "\"NaN\"";
      uVar13 = 5;
    }
    else {
      if (ABS(v_01) != INFINITY) {
        appendDouble(this,v_01);
        return;
      }
      if (this->options->unsupportedDoublesAsString == false) {
LAB_00108e0a:
        handleUnsupportedType(this,local_60);
        return;
      }
      local_38 = v_01;
      (*this->_sink->_vptr_Sink[2])(this->_sink,0x22);
      if (local_38 <= -INFINITY) {
        (*this->_sink->_vptr_Sink[2])(this->_sink,0x2d);
      }
      pSVar14 = this->_sink;
      pp_Var9 = pSVar14->_vptr_Sink;
      pcVar6 = "Infinity\"";
      uVar13 = 9;
    }
    (*pp_Var9[3])(pSVar14,pcVar6,uVar13);
    break;
  case UTCDate:
    if (this->options->datesAsIntegers == true) {
      v = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getUTCDate
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     &local_60);
      appendInt(this,v);
      return;
    }
    goto switchD_001086cd_caseD_0;
  case External:
    if (base == (Slice *)0x0) {
      base = &local_60;
    }
    SVar8._start = (uint8_t *)
                   SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getExternal
                             ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *
                              )&local_60);
    dumpValue(this,SVar8,base);
    break;
  case Int:
  case UInt:
  case SmallInt:
    dumpInteger(this,slice);
    return;
  case String:
    pcVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getString
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        &local_60,(ValueLength *)&local_58);
    (*this->_sink->_vptr_Sink[4])(this->_sink,local_58._slice._start + 2);
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x22);
    dumpString(this,pcVar6,(ValueLength)local_58._slice._start);
    goto LAB_00108ad0;
  case Binary:
    if (this->options->binaryAsHex != true) goto switchD_001086cd_caseD_0;
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x22);
    puVar7 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBinary
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        &local_60,(ValueLength *)&local_58);
    if (local_58._slice._start != (uint8_t *)0x0) {
      puVar15 = (uint8_t *)0x0;
      do {
        bVar2 = puVar7[(long)puVar15];
        uVar11 = (uint)(byte)((bVar2 >> 4) + 0x57);
        if (bVar2 < 0xa0) {
          uVar11 = (bVar2 >> 4) + 0x30;
        }
        (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)uVar11);
        bVar2 = bVar2 & 0xf;
        bVar10 = bVar2 + 0x57;
        if (bVar2 < 10) {
          bVar10 = bVar2 + 0x30;
        }
        (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)bVar10);
        puVar15 = puVar15 + 1;
      } while (puVar15 < local_58._slice._start);
    }
LAB_00108ad0:
    pSVar14 = this->_sink;
    pp_Var9 = pSVar14->_vptr_Sink;
    uVar13 = 0x22;
LAB_00108adc:
    (*pp_Var9[2])(pSVar14,uVar13);
    break;
  case BCD:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    type = NotImplemented;
LAB_00108dce:
    Exception::Exception(this_00,type);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  case Custom:
    pCVar1 = this->options->customTypeHandler;
    if (pCVar1 == (CustomTypeHandler *)0x0) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      type = NeedCustomTypeHandler;
      goto LAB_00108dce;
    }
    if (base == (Slice *)0x0) {
      base = &local_60;
    }
    (*pCVar1->_vptr_CustomTypeHandler[2])(pCVar1,&local_60,this,base);
    break;
  case Tagged:
    if ((bVar2 & 0xfe) == 0xee) {
      bVar10 = 0;
      SVar8._start = slice._start;
      do {
        pbVar12 = SVar8._start + 9;
        cVar3 = '\t';
        if (bVar2 == 0xee) {
          cVar3 = '\x02';
          pbVar12 = SVar8._start + 2;
        }
        bVar10 = bVar10 + cVar3;
        bVar2 = *pbVar12;
        SVar8._start = pbVar12;
      } while ((bVar2 & 0xfe) == 0xee);
      slice._start = slice._start + bVar10;
    }
    dump(this,slice);
    return;
  }
  return;
switchD_001086cd_caseD_0:
  handleUnsupportedType(this,slice);
  return;
}

Assistant:

void Dumper::dumpValue(Slice slice, Slice const* base) {
  if (options->debugTags && slice.isTagged()) {
    appendUInt(slice.getFirstTag());
    _sink->push_back(':');
  }

  switch (slice.type()) {
    case ValueType::Null: {
      _sink->append("null", 4);
      break;
    }

    case ValueType::Bool: {
      if (slice.getBool()) {
        _sink->append("true", 4);
      } else {
        _sink->append("false", 5);
      }
      break;
    }

    case ValueType::Array: {
      ArrayIterator it(slice);
      _sink->push_back('[');
      if (options->prettyPrint) {
        _sink->push_back('\n');
        ++_indentation;
        while (it.valid()) {
          indent();
          dumpValue(it.value(), &slice);
          if (it.index() + 1 != it.size()) {
            _sink->push_back(',');
          }
          _sink->push_back('\n');
          it.next();
        }
        --_indentation;
        indent();
      } else if (options->singleLinePrettyPrint) {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
            _sink->push_back(' ');
          }
          dumpValue(it.value(), &slice);
          it.next();
        }
      } else {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
          }
          dumpValue(it.value(), &slice);
          it.next();
        }
      }
      _sink->push_back(']');
      break;
    }

    case ValueType::Object: {
      ObjectIterator it(slice, !options->dumpAttributesInIndexOrder);
      _sink->push_back('{');
      if (options->prettyPrint) {
        _sink->push_back('\n');
        ++_indentation;
        while (it.valid()) {
          auto current = (*it);
          indent();
          dumpValue(current.key, &slice);
          _sink->append(" : ", 3);
          dumpValue(current.value, &slice);
          if (it.index() + 1 != it.size()) {
            _sink->push_back(',');
          }
          _sink->push_back('\n');
          it.next();
        }
        --_indentation;
        indent();
      } else if (options->singleLinePrettyPrint) {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
            _sink->push_back(' ');
          }
          auto current = (*it);
          dumpValue(current.key, &slice);
          _sink->push_back(':');
          _sink->push_back(' ');
          dumpValue(current.value, &slice);
          it.next();
        }
      } else {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
          }
          auto current = (*it);
          dumpValue(current.key, &slice);
          _sink->push_back(':');
          dumpValue(current.value, &slice);
          it.next();
        }
      }
      _sink->push_back('}');
      break;
    }

    case ValueType::Double: {
      double const v = slice.getDouble();

      if (!std::isnan(v) && !std::isinf(v)) {
        appendDouble(v);
        break;
      }

      if (options->unsupportedDoublesAsString) {
        if (std::isnan(v)) {
          _sink->append("\"NaN\"", 5);
          break;
        } else if (std::isinf(v)) {
          _sink->push_back('"');
          if (v == -INFINITY) {
            _sink->push_back('-');
          }
          _sink->append("Infinity\"", 9);
          break;
        }
      }

      handleUnsupportedType(slice);
      break;
    }

    case ValueType::Int:
    case ValueType::UInt:
    case ValueType::SmallInt: {
      dumpInteger(slice);
      break;
    }

    case ValueType::String: {
      ValueLength len;
      char const* p = slice.getString(len);
      _sink->reserve(2 + len);
      _sink->push_back('"');
      dumpString(p, len);
      _sink->push_back('"');
      break;
    }

    case ValueType::External: {
      if (base == nullptr) {
        base = &slice;
      }

      Slice external(reinterpret_cast<uint8_t const*>(slice.getExternal()));
      dumpValue(external, base);
      break;
    }

    case ValueType::Tagged: {
      dump(slice.value());
      break;
    }

    case ValueType::Binary: {
      if (options->binaryAsHex) {
        _sink->push_back('"');
        ValueLength len;
        uint8_t const* bin = slice.getBinary(len);
        for (ValueLength i = 0; i < len; ++i) {
          uint8_t value = bin[i];
          uint8_t x = value / 16;
          _sink->push_back((x < 10 ? ('0' + x) : ('a' + x - 10)));
          x = value % 16;
          _sink->push_back((x < 10 ? ('0' + x) : ('a' + x - 10)));
        }
        _sink->push_back('"');
      } else {
        handleUnsupportedType(slice);
      }
      break;
    }

    case ValueType::UTCDate: {
      if (options->datesAsIntegers) {
        appendInt(slice.getUTCDate());
      } else {
        handleUnsupportedType(slice);
      }
      break;
    }

    case ValueType::None:
    case ValueType::Illegal:
    case ValueType::MinKey:
    case ValueType::MaxKey: {
      handleUnsupportedType(slice);
      break;
    }

    case ValueType::BCD: {
      // TODO
      throw Exception(Exception::NotImplemented);
    }

    case ValueType::Custom: {
      if (options->customTypeHandler == nullptr) {
        throw Exception(Exception::NeedCustomTypeHandler);
      }
      if (base == nullptr) {
        base = &slice;
      }
      options->customTypeHandler->dump(slice, this, *base);
      break;
    }
  }
}